

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,true,false,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  if (count == 0) {
    lVar15 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    psVar5 = false_sel->sel_vector;
    lVar15 = 0;
    uVar13 = 0;
    do {
      uVar12 = uVar13;
      if (psVar1 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar1[uVar13];
      }
      uVar14 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar2[uVar13];
      }
      uVar9 = uVar13;
      if (psVar3 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar3[uVar13];
      }
      uVar10 = uVar13;
      if (psVar4 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar4[uVar13];
      }
      lVar16._0_4_ = adata[uVar14].months;
      lVar16._4_4_ = adata[uVar14].days;
      lVar8._0_4_ = bdata[uVar9].months;
      lVar8._4_4_ = bdata[uVar9].days;
      lVar7 = (lVar8 >> 0x20) + bdata[uVar9].micros / 86400000000;
      lVar11 = lVar7 % 0x1e;
      lVar17 = (long)(int)(undefined4)lVar8 + lVar7 / 0x1e;
      lVar8 = (lVar16 >> 0x20) + adata[uVar14].micros / 86400000000;
      lVar18 = adata[uVar14].micros % 86400000000;
      lVar7 = lVar8 % 0x1e;
      lVar16 = (long)(int)(undefined4)lVar16 + lVar8 / 0x1e;
      uVar14 = 1;
      if (lVar17 <= lVar16) {
        lVar6._0_4_ = cdata[uVar10].months;
        lVar6._4_4_ = cdata[uVar10].days;
        if ((lVar17 < lVar16) ||
           ((lVar11 <= lVar7 && ((lVar11 < lVar7 || (bdata[uVar9].micros % 86400000000 <= lVar18))))
           )) {
          lVar11 = (lVar6 >> 0x20) + cdata[uVar10].micros / 86400000000;
          lVar8 = lVar11 % 0x1e;
          lVar11 = (long)(int)(undefined4)lVar6 + lVar11 / 0x1e;
          if (lVar16 < lVar11) {
            uVar14 = 0;
          }
          else if (lVar16 <= lVar11) {
            if (lVar7 < lVar8) {
              uVar14 = 0;
            }
            else {
              uVar14 = (ulong)(cdata[uVar10].micros % 86400000000 <= lVar18 || lVar8 < lVar7);
            }
          }
        }
      }
      psVar5[lVar15] = (sel_t)uVar12;
      lVar15 = uVar14 + lVar15;
      uVar13 = uVar13 + 1;
    } while (count != uVar13);
  }
  return count - lVar15;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}